

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void nni_list_append(nni_list *list,void *item)

{
  long *plVar1;
  nni_list_node *node;
  void *item_local;
  nni_list *list_local;
  
  plVar1 = (long *)((long)item + list->ll_offset);
  if ((*plVar1 != 0) || (plVar1[1] != 0)) {
    nni_panic("appending node already on a list or not inited");
  }
  plVar1[1] = (long)(list->ll_head).ln_prev;
  *plVar1 = (long)list;
  *(long **)(*plVar1 + 8) = plVar1;
  *(long **)plVar1[1] = plVar1;
  return;
}

Assistant:

void
nni_list_append(nni_list *list, void *item)
{
	nni_list_node *node = NODE(list, item);

	if ((node->ln_next != NULL) || (node->ln_prev != NULL)) {
		nni_panic("appending node already on a list or not inited");
	}
	node->ln_prev          = list->ll_head.ln_prev;
	node->ln_next          = &list->ll_head;
	node->ln_next->ln_prev = node;
	node->ln_prev->ln_next = node;
}